

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_mem.c
# Opt level: O3

amqp_pool_t * amqp_get_or_create_channel_pool(amqp_connection_state_t state,amqp_channel_t channel)

{
  amqp_pool_table_entry_t *paVar1;
  amqp_pool_table_entry_t *paVar2;
  amqp_pool_table_entry_t_ *paVar3;
  int iVar4;
  
  paVar1 = (amqp_pool_table_entry_t *)(state->pool_table + (channel & 0xf));
  paVar2 = paVar1;
  do {
    paVar2 = paVar2->next;
    if (paVar2 == (amqp_pool_table_entry_t *)0x0) {
      paVar3 = (amqp_pool_table_entry_t_ *)malloc(0x50);
      if (paVar3 == (amqp_pool_table_entry_t_ *)0x0) {
        return (amqp_pool_t *)0x0;
      }
      paVar3->channel = channel;
      paVar3->next = paVar1->next;
      paVar1->next = paVar3;
      iVar4 = 0x1000;
      if (state->frame_max != 0) {
        iVar4 = state->frame_max;
      }
      (paVar3->pool).pagesize = (long)iVar4;
      (paVar3->pool).pages.num_blocks = 0;
      (paVar3->pool).pages.blocklist = (void **)0x0;
      (paVar3->pool).large_blocks.num_blocks = 0;
      (paVar3->pool).large_blocks.blocklist = (void **)0x0;
      (paVar3->pool).next_page = 0;
      (paVar3->pool).alloc_block = (char *)0x0;
      (paVar3->pool).alloc_used = 0;
      return &paVar3->pool;
    }
  } while (paVar2->channel != channel);
  return &paVar2->pool;
}

Assistant:

amqp_pool_t *amqp_get_or_create_channel_pool(amqp_connection_state_t state, amqp_channel_t channel)
{
  amqp_pool_table_entry_t *entry;
  size_t index = channel % POOL_TABLE_SIZE;

  entry = state->pool_table[index];

  for ( ; NULL != entry; entry = entry->next) {
    if (channel == entry->channel) {
      return &entry->pool;
    }
  }

  entry = malloc(sizeof(amqp_pool_table_entry_t));
  if (NULL == entry) {
    return NULL;
  }

  entry->channel = channel;
  entry->next = state->pool_table[index];
  state->pool_table[index] = entry;

  init_amqp_pool(&entry->pool, state->frame_max);

  return &entry->pool;
}